

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O2

ptr<rpc_listener> __thiscall
nuraft::asio_service::create_rpc_listener(asio_service *this,ushort listening_port,ptr<logger> *l)

{
  context *__args_2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined6 in_register_00000032;
  ptr<rpc_listener> pVar2;
  ushort listening_port_local;
  delayed_task_scheduler local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [3];
  
  listening_port_local = (ushort)l;
  __args_2 = *(context **)(CONCAT62(in_register_00000032,listening_port) + 0x10);
  std::
  make_shared<nuraft::asio_rpc_listener,nuraft::asio_service_impl*&,asio::io_context&,asio::ssl::context&,unsigned_short&,bool&,std::shared_ptr<nuraft::logger>&>
            ((asio_service_impl **)&local_38,
             (io_context *)(CONCAT62(in_register_00000032,listening_port) + 0x10),__args_2,
             (unsigned_short *)
             &(__args_2->init_).ref_.
              super___shared_ptr<asio::ssl::detail::openssl_init_base::do_init,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,(bool *)&listening_port_local,
             (shared_ptr<nuraft::logger> *)(__args_2 + 0x12));
  _Var1._M_pi = a_Stack_30[0]._M_pi;
  a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_delayed_task_scheduler)._vptr_delayed_task_scheduler =
       local_38._vptr_delayed_task_scheduler;
  (this->super_rpc_client_factory)._vptr_rpc_client_factory = (_func_int **)_Var1._M_pi;
  local_38._vptr_delayed_task_scheduler = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_30);
  pVar2.super___shared_ptr<nuraft::rpc_listener,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar2.super___shared_ptr<nuraft::rpc_listener,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<rpc_listener>)
         pVar2.super___shared_ptr<nuraft::rpc_listener,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<rpc_listener> asio_service::create_rpc_listener( ushort listening_port,
                                                     ptr<logger>& l )
{
    try {
        return cs_new< asio_rpc_listener >
                     ( impl_,
                       impl_->io_svc_,
                       impl_->ssl_server_ctx_,
                       listening_port,
                       impl_->my_opt_.enable_ssl_,
                       l );
    } catch (std::exception& ee) {
        // Most likely exception happens due to wrong endpoint.
        p_er("got exception: %s", ee.what());
        return nullptr;
    }
}